

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# highbd_inv_txfm_sse4.c
# Opt level: O1

void iadst16x16_low1_sse4_1(__m128i *in,__m128i *out,int bit,int do_cols,int bd,int out_shift)

{
  undefined4 uVar1;
  int iVar2;
  long lVar3;
  int iVar4;
  int iVar5;
  int iVar7;
  int iVar8;
  undefined1 auVar6 [16];
  int iVar9;
  int iVar10;
  int iVar11;
  int iVar12;
  int iVar13;
  undefined1 auVar14 [16];
  __m128i alVar15;
  int iVar16;
  int iVar18;
  int iVar19;
  undefined1 auVar17 [16];
  int iVar20;
  int iVar21;
  int iVar23;
  int iVar24;
  undefined1 auVar22 [16];
  int iVar25;
  int iVar26;
  int iVar29;
  int iVar30;
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  int iVar31;
  int iVar32;
  uint uVar33;
  int iVar36;
  uint uVar37;
  int iVar38;
  uint uVar39;
  undefined1 auVar34 [16];
  __m128i alVar35;
  int iVar40;
  uint uVar41;
  int iVar42;
  int iVar43;
  int iVar44;
  int iVar45;
  undefined1 auVar46 [16];
  int iVar47;
  uint uVar48;
  uint uVar50;
  uint uVar51;
  __m128i offset;
  undefined1 auVar49 [16];
  uint uVar52;
  undefined1 auVar53 [16];
  __m128i alVar54;
  undefined1 auVar55 [16];
  int iVar56;
  int iVar58;
  int iVar59;
  undefined1 auVar57 [16];
  int iVar60;
  int iVar61;
  int iVar62;
  int iVar64;
  int iVar65;
  int iVar66;
  int iVar67;
  longlong lStack_30;
  undefined1 auVar63 [16];
  
  auVar49 = ZEXT416((uint)bit);
  lVar3 = (long)bit * 0x100;
  uVar1 = *(undefined4 *)((long)vert_filter_length_chroma + lVar3 + 0x168);
  auVar17._4_4_ = uVar1;
  auVar17._0_4_ = uVar1;
  auVar17._8_4_ = uVar1;
  auVar17._12_4_ = uVar1;
  uVar1 = *(undefined4 *)((long)vert_filter_length_chroma + lVar3 + 600);
  auVar27._4_4_ = uVar1;
  auVar27._0_4_ = uVar1;
  auVar27._8_4_ = uVar1;
  auVar27._12_4_ = uVar1;
  uVar1 = *(undefined4 *)((long)vert_filter_length_chroma + lVar3 + 0x180);
  auVar14._4_4_ = uVar1;
  auVar14._0_4_ = uVar1;
  auVar14._8_4_ = uVar1;
  auVar14._12_4_ = uVar1;
  uVar1 = *(undefined4 *)((long)vert_filter_length_chroma + lVar3 + 0x240);
  auVar57._4_4_ = uVar1;
  auVar57._0_4_ = uVar1;
  auVar57._8_4_ = uVar1;
  auVar57._12_4_ = uVar1;
  uVar1 = *(undefined4 *)((long)vert_filter_length_chroma + lVar3 + 0x220);
  auVar28._4_4_ = uVar1;
  auVar28._0_4_ = uVar1;
  auVar28._8_4_ = uVar1;
  auVar28._12_4_ = uVar1;
  uVar1 = *(undefined4 *)((long)vert_filter_length_chroma + lVar3 + 0x1a0);
  iVar4 = 1 << ((char)bit - 1U & 0x1f);
  auVar6._4_4_ = uVar1;
  auVar6._0_4_ = uVar1;
  auVar6._8_4_ = uVar1;
  auVar6._12_4_ = uVar1;
  auVar34 = pmulld(auVar27,(undefined1  [16])*in);
  alVar35[0]._0_4_ = auVar34._0_4_ + iVar4 >> auVar49;
  alVar35[0]._4_4_ = auVar34._4_4_ + iVar4 >> auVar49;
  alVar35[1]._0_4_ = auVar34._8_4_ + iVar4 >> auVar49;
  alVar35[1]._4_4_ = auVar34._12_4_ + iVar4 >> auVar49;
  uVar1 = *(undefined4 *)((long)vert_filter_length_chroma + lVar3 + 0x1e0);
  auVar17 = pmulld(auVar17,(undefined1  [16])*in);
  auVar22._0_4_ = iVar4 - auVar17._0_4_ >> auVar49;
  auVar22._4_4_ = iVar4 - auVar17._4_4_ >> auVar49;
  auVar22._8_4_ = iVar4 - auVar17._8_4_ >> auVar49;
  auVar22._12_4_ = iVar4 - auVar17._12_4_ >> auVar49;
  auVar34 = pmulld((undefined1  [16])alVar35,auVar14);
  auVar17 = pmulld(auVar22,auVar57);
  auVar55._0_4_ = auVar34._0_4_ + iVar4 + auVar17._0_4_ >> auVar49;
  auVar55._4_4_ = auVar34._4_4_ + iVar4 + auVar17._4_4_ >> auVar49;
  auVar55._8_4_ = auVar34._8_4_ + iVar4 + auVar17._8_4_ >> auVar49;
  auVar55._12_4_ = auVar34._12_4_ + iVar4 + auVar17._12_4_ >> auVar49;
  auVar17 = pmulld(auVar57,(undefined1  [16])alVar35);
  auVar14 = pmulld(auVar14,auVar22);
  iVar61 = (auVar17._0_4_ + iVar4) - auVar14._0_4_ >> auVar49;
  iVar64 = (auVar17._4_4_ + iVar4) - auVar14._4_4_ >> auVar49;
  auVar63._0_8_ = CONCAT44(iVar64,iVar61);
  auVar63._8_4_ = (auVar17._8_4_ + iVar4) - auVar14._8_4_ >> auVar49;
  auVar63._12_4_ = (auVar17._12_4_ + iVar4) - auVar14._12_4_ >> auVar49;
  auVar17 = pmulld((undefined1  [16])alVar35,auVar6);
  auVar14 = pmulld(auVar22,auVar28);
  auVar53._0_4_ = auVar17._0_4_ + iVar4 + auVar14._0_4_ >> auVar49;
  auVar53._4_4_ = auVar17._4_4_ + iVar4 + auVar14._4_4_ >> auVar49;
  auVar53._8_4_ = auVar17._8_4_ + iVar4 + auVar14._8_4_ >> auVar49;
  auVar53._12_4_ = auVar17._12_4_ + iVar4 + auVar14._12_4_ >> auVar49;
  auVar14 = pmulld((undefined1  [16])alVar35,auVar28);
  auVar17 = pmulld(auVar6,auVar22);
  alVar15[0]._0_4_ = (auVar14._0_4_ + iVar4) - auVar17._0_4_ >> auVar49;
  alVar15[0]._4_4_ = (auVar14._4_4_ + iVar4) - auVar17._4_4_ >> auVar49;
  alVar15[1]._0_4_ = (auVar14._8_4_ + iVar4) - auVar17._8_4_ >> auVar49;
  alVar15[1]._4_4_ = (auVar14._12_4_ + iVar4) - auVar17._12_4_ >> auVar49;
  auVar17 = pmulld(auVar55,auVar6);
  auVar14 = pmulld(auVar63,auVar28);
  alVar54[0]._0_4_ = auVar17._0_4_ + iVar4 + auVar14._0_4_ >> auVar49;
  alVar54[0]._4_4_ = auVar17._4_4_ + iVar4 + auVar14._4_4_ >> auVar49;
  alVar54[1]._0_4_ = auVar17._8_4_ + iVar4 + auVar14._8_4_ >> auVar49;
  alVar54[1]._4_4_ = auVar17._12_4_ + iVar4 + auVar14._12_4_ >> auVar49;
  auVar34._4_4_ = uVar1;
  auVar34._0_4_ = uVar1;
  auVar34._8_4_ = uVar1;
  auVar34._12_4_ = uVar1;
  auVar57 = pmulld(auVar28,auVar55);
  auVar14 = pmulld(auVar6,auVar63);
  auVar6 = pmulld((undefined1  [16])alVar35,auVar34);
  auVar17 = pmulld(auVar22,auVar34);
  iVar5 = auVar6._0_4_ + iVar4;
  iVar7 = auVar6._4_4_ + iVar4;
  iVar8 = auVar6._8_4_ + iVar4;
  iVar9 = auVar6._12_4_ + iVar4;
  auVar6 = pmulld(auVar53,auVar34);
  auVar27 = pmulld((undefined1  [16])alVar15,auVar34);
  iVar10 = auVar6._0_4_ + iVar4;
  iVar11 = auVar6._4_4_ + iVar4;
  iVar12 = auVar6._8_4_ + iVar4;
  iVar13 = auVar6._12_4_ + iVar4;
  auVar6 = pmulld(auVar55,auVar34);
  auVar28 = pmulld(auVar63,auVar34);
  iVar42 = auVar6._0_4_ + iVar4;
  iVar43 = auVar6._4_4_ + iVar4;
  iVar44 = auVar6._8_4_ + iVar4;
  iVar45 = auVar6._12_4_ + iVar4;
  auVar6 = pmulld((undefined1  [16])alVar54,auVar34);
  iVar26 = auVar6._0_4_ + iVar4;
  iVar29 = auVar6._4_4_ + iVar4;
  iVar30 = auVar6._8_4_ + iVar4;
  iVar31 = auVar6._12_4_ + iVar4;
  auVar46._0_4_ = (auVar57._0_4_ + iVar4) - auVar14._0_4_ >> auVar49;
  auVar46._4_4_ = (auVar57._4_4_ + iVar4) - auVar14._4_4_ >> auVar49;
  auVar46._8_4_ = (auVar57._8_4_ + iVar4) - auVar14._8_4_ >> auVar49;
  auVar46._12_4_ = (auVar57._12_4_ + iVar4) - auVar14._12_4_ >> auVar49;
  auVar6 = pmulld(auVar34,auVar46);
  iVar16 = iVar5 + auVar17._0_4_ >> auVar49;
  iVar18 = iVar7 + auVar17._4_4_ >> auVar49;
  iVar19 = iVar8 + auVar17._8_4_ >> auVar49;
  iVar20 = iVar9 + auVar17._12_4_ >> auVar49;
  iVar4 = iVar5 - auVar17._0_4_ >> auVar49;
  iVar5 = iVar7 - auVar17._4_4_ >> auVar49;
  iVar7 = iVar8 - auVar17._8_4_ >> auVar49;
  iVar8 = iVar9 - auVar17._12_4_ >> auVar49;
  iVar21 = iVar10 + auVar27._0_4_ >> auVar49;
  iVar23 = iVar11 + auVar27._4_4_ >> auVar49;
  iVar24 = iVar12 + auVar27._8_4_ >> auVar49;
  iVar25 = iVar13 + auVar27._12_4_ >> auVar49;
  iVar9 = iVar10 - auVar27._0_4_ >> auVar49;
  iVar10 = iVar11 - auVar27._4_4_ >> auVar49;
  iVar11 = iVar12 - auVar27._8_4_ >> auVar49;
  iVar12 = iVar13 - auVar27._12_4_ >> auVar49;
  iVar62 = iVar42 + auVar28._0_4_ >> auVar49;
  iVar65 = iVar43 + auVar28._4_4_ >> auVar49;
  iVar66 = iVar44 + auVar28._8_4_ >> auVar49;
  iVar67 = iVar45 + auVar28._12_4_ >> auVar49;
  iVar42 = iVar42 - auVar28._0_4_ >> auVar49;
  iVar43 = iVar43 - auVar28._4_4_ >> auVar49;
  iVar44 = iVar44 - auVar28._8_4_ >> auVar49;
  iVar45 = iVar45 - auVar28._12_4_ >> auVar49;
  iVar56 = iVar26 + auVar6._0_4_ >> auVar49;
  iVar58 = iVar29 + auVar6._4_4_ >> auVar49;
  iVar59 = iVar30 + auVar6._8_4_ >> auVar49;
  iVar60 = iVar31 + auVar6._12_4_ >> auVar49;
  iVar13 = iVar26 - auVar6._0_4_ >> auVar49;
  iVar26 = iVar29 - auVar6._4_4_ >> auVar49;
  iVar29 = iVar30 - auVar6._8_4_ >> auVar49;
  iVar30 = iVar31 - auVar6._12_4_ >> auVar49;
  if (do_cols != 0) {
    *out = alVar35;
    *(int *)out[1] = -auVar55._0_4_;
    *(int *)((long)out[1] + 4) = -auVar55._4_4_;
    *(int *)(out[1] + 1) = -auVar55._8_4_;
    *(int *)((long)out[1] + 0xc) = -auVar55._12_4_;
    out[2] = alVar54;
    *(int *)out[3] = -auVar53._0_4_;
    *(int *)((long)out[3] + 4) = -auVar53._4_4_;
    *(int *)(out[3] + 1) = -auVar53._8_4_;
    *(int *)((long)out[3] + 0xc) = -auVar53._12_4_;
    *(int *)out[4] = iVar21;
    *(int *)((long)out[4] + 4) = iVar23;
    *(int *)(out[4] + 1) = iVar24;
    *(int *)((long)out[4] + 0xc) = iVar25;
    *(int *)out[5] = -iVar56;
    *(int *)((long)out[5] + 4) = -iVar58;
    *(int *)(out[5] + 1) = -iVar59;
    *(int *)((long)out[5] + 0xc) = -iVar60;
    *(int *)out[6] = iVar62;
    *(int *)((long)out[6] + 4) = iVar65;
    *(int *)(out[6] + 1) = iVar66;
    *(int *)((long)out[6] + 0xc) = iVar67;
    *(int *)out[7] = -iVar16;
    *(int *)((long)out[7] + 4) = -iVar18;
    *(int *)(out[7] + 1) = -iVar19;
    *(int *)((long)out[7] + 0xc) = -iVar20;
    *(int *)out[8] = iVar4;
    *(int *)((long)out[8] + 4) = iVar5;
    *(int *)(out[8] + 1) = iVar7;
    *(int *)((long)out[8] + 0xc) = iVar8;
    *(int *)out[9] = -iVar42;
    *(int *)((long)out[9] + 4) = -iVar43;
    *(int *)(out[9] + 1) = -iVar44;
    *(int *)((long)out[9] + 0xc) = -iVar45;
    *(int *)out[10] = iVar13;
    *(int *)((long)out[10] + 4) = iVar26;
    *(int *)(out[10] + 1) = iVar29;
    *(int *)((long)out[10] + 0xc) = iVar30;
    *(int *)out[0xb] = -iVar9;
    *(int *)((long)out[0xb] + 4) = -iVar10;
    *(int *)(out[0xb] + 1) = -iVar11;
    *(int *)((long)out[0xb] + 0xc) = -iVar12;
    out[0xc] = alVar15;
    *(int *)out[0xd] = -auVar46._0_4_;
    *(int *)((long)out[0xd] + 4) = -auVar46._4_4_;
    *(int *)(out[0xd] + 1) = -auVar46._8_4_;
    *(int *)((long)out[0xd] + 0xc) = -auVar46._12_4_;
    lStack_30 = auVar63._8_8_;
    out[0xe][0] = auVar63._0_8_;
    out[0xe][1] = lStack_30;
    *(int *)out[0xf] = -auVar22._0_4_;
    *(int *)((long)out[0xf] + 4) = -auVar22._4_4_;
    *(int *)(out[0xf] + 1) = -auVar22._8_4_;
    *(int *)((long)out[0xf] + 0xc) = -auVar22._12_4_;
    return;
  }
  iVar31 = 10;
  if (10 < bd) {
    iVar31 = bd;
  }
  iVar31 = 0x20 << ((byte)iVar31 & 0x1f);
  iVar47 = (1 << ((byte)out_shift & 0x1f)) >> 1;
  iVar2 = -iVar31;
  iVar31 = iVar31 + -1;
  auVar6 = ZEXT416((uint)out_shift);
  iVar32 = (int)alVar35[0] + iVar47 >> auVar6;
  iVar36 = alVar35[0]._4_4_ + iVar47 >> auVar6;
  iVar38 = (int)alVar35[1] + iVar47 >> auVar6;
  iVar40 = alVar35[1]._4_4_ + iVar47 >> auVar6;
  uVar33 = (uint)(iVar32 < iVar2) * iVar2 | (uint)(iVar32 >= iVar2) * iVar32;
  uVar37 = (uint)(iVar36 < iVar2) * iVar2 | (uint)(iVar36 >= iVar2) * iVar36;
  uVar39 = (uint)(iVar38 < iVar2) * iVar2 | (uint)(iVar38 >= iVar2) * iVar38;
  uVar41 = (uint)(iVar40 < iVar2) * iVar2 | (uint)(iVar40 >= iVar2) * iVar40;
  *(uint *)*out = (uint)(iVar31 < (int)uVar33) * iVar31 | (iVar31 >= (int)uVar33) * uVar33;
  *(uint *)((long)*out + 4) =
       (uint)(iVar31 < (int)uVar37) * iVar31 | (iVar31 >= (int)uVar37) * uVar37;
  *(uint *)(*out + 1) = (uint)(iVar31 < (int)uVar39) * iVar31 | (iVar31 >= (int)uVar39) * uVar39;
  *(uint *)((long)*out + 0xc) =
       (uint)(iVar31 < (int)uVar41) * iVar31 | (iVar31 >= (int)uVar41) * uVar41;
  iVar32 = iVar47 - auVar55._0_4_ >> auVar6;
  iVar36 = iVar47 - auVar55._4_4_ >> auVar6;
  iVar38 = iVar47 - auVar55._8_4_ >> auVar6;
  iVar40 = iVar47 - auVar55._12_4_ >> auVar6;
  uVar33 = (uint)(iVar32 < iVar2) * iVar2 | (uint)(iVar32 >= iVar2) * iVar32;
  uVar37 = (uint)(iVar36 < iVar2) * iVar2 | (uint)(iVar36 >= iVar2) * iVar36;
  uVar39 = (uint)(iVar38 < iVar2) * iVar2 | (uint)(iVar38 >= iVar2) * iVar38;
  uVar41 = (uint)(iVar40 < iVar2) * iVar2 | (uint)(iVar40 >= iVar2) * iVar40;
  *(uint *)out[1] = (uint)(iVar31 < (int)uVar33) * iVar31 | (iVar31 >= (int)uVar33) * uVar33;
  *(uint *)((long)out[1] + 4) =
       (uint)(iVar31 < (int)uVar37) * iVar31 | (iVar31 >= (int)uVar37) * uVar37;
  *(uint *)(out[1] + 1) = (uint)(iVar31 < (int)uVar39) * iVar31 | (iVar31 >= (int)uVar39) * uVar39;
  *(uint *)((long)out[1] + 0xc) =
       (uint)(iVar31 < (int)uVar41) * iVar31 | (iVar31 >= (int)uVar41) * uVar41;
  iVar32 = (int)alVar54[0] + iVar47 >> auVar6;
  iVar36 = alVar54[0]._4_4_ + iVar47 >> auVar6;
  iVar38 = (int)alVar54[1] + iVar47 >> auVar6;
  iVar40 = alVar54[1]._4_4_ + iVar47 >> auVar6;
  uVar33 = (uint)(iVar32 < iVar2) * iVar2 | (uint)(iVar32 >= iVar2) * iVar32;
  uVar37 = (uint)(iVar36 < iVar2) * iVar2 | (uint)(iVar36 >= iVar2) * iVar36;
  uVar39 = (uint)(iVar38 < iVar2) * iVar2 | (uint)(iVar38 >= iVar2) * iVar38;
  uVar41 = (uint)(iVar40 < iVar2) * iVar2 | (uint)(iVar40 >= iVar2) * iVar40;
  *(uint *)out[2] = (uint)(iVar31 < (int)uVar33) * iVar31 | (iVar31 >= (int)uVar33) * uVar33;
  *(uint *)((long)out[2] + 4) =
       (uint)(iVar31 < (int)uVar37) * iVar31 | (iVar31 >= (int)uVar37) * uVar37;
  *(uint *)(out[2] + 1) = (uint)(iVar31 < (int)uVar39) * iVar31 | (iVar31 >= (int)uVar39) * uVar39;
  *(uint *)((long)out[2] + 0xc) =
       (uint)(iVar31 < (int)uVar41) * iVar31 | (iVar31 >= (int)uVar41) * uVar41;
  iVar32 = iVar47 - auVar53._0_4_ >> auVar6;
  iVar36 = iVar47 - auVar53._4_4_ >> auVar6;
  iVar38 = iVar47 - auVar53._8_4_ >> auVar6;
  iVar40 = iVar47 - auVar53._12_4_ >> auVar6;
  uVar33 = (uint)(iVar32 < iVar2) * iVar2 | (uint)(iVar32 >= iVar2) * iVar32;
  uVar37 = (uint)(iVar36 < iVar2) * iVar2 | (uint)(iVar36 >= iVar2) * iVar36;
  uVar39 = (uint)(iVar38 < iVar2) * iVar2 | (uint)(iVar38 >= iVar2) * iVar38;
  uVar41 = (uint)(iVar40 < iVar2) * iVar2 | (uint)(iVar40 >= iVar2) * iVar40;
  *(uint *)out[3] = (uint)(iVar31 < (int)uVar33) * iVar31 | (iVar31 >= (int)uVar33) * uVar33;
  *(uint *)((long)out[3] + 4) =
       (uint)(iVar31 < (int)uVar37) * iVar31 | (iVar31 >= (int)uVar37) * uVar37;
  *(uint *)(out[3] + 1) = (uint)(iVar31 < (int)uVar39) * iVar31 | (iVar31 >= (int)uVar39) * uVar39;
  *(uint *)((long)out[3] + 0xc) =
       (uint)(iVar31 < (int)uVar41) * iVar31 | (iVar31 >= (int)uVar41) * uVar41;
  iVar32 = iVar21 + iVar47 >> auVar6;
  iVar36 = iVar23 + iVar47 >> auVar6;
  iVar38 = iVar24 + iVar47 >> auVar6;
  iVar40 = iVar25 + iVar47 >> auVar6;
  iVar21 = iVar47 - iVar56 >> auVar6;
  iVar23 = iVar47 - iVar58 >> auVar6;
  iVar24 = iVar47 - iVar59 >> auVar6;
  iVar25 = iVar47 - iVar60 >> auVar6;
  uVar33 = (uint)(iVar32 < iVar2) * iVar2 | (uint)(iVar32 >= iVar2) * iVar32;
  uVar37 = (uint)(iVar36 < iVar2) * iVar2 | (uint)(iVar36 >= iVar2) * iVar36;
  uVar39 = (uint)(iVar38 < iVar2) * iVar2 | (uint)(iVar38 >= iVar2) * iVar38;
  uVar41 = (uint)(iVar40 < iVar2) * iVar2 | (uint)(iVar40 >= iVar2) * iVar40;
  *(uint *)out[4] = (uint)(iVar31 < (int)uVar33) * iVar31 | (iVar31 >= (int)uVar33) * uVar33;
  *(uint *)((long)out[4] + 4) =
       (uint)(iVar31 < (int)uVar37) * iVar31 | (iVar31 >= (int)uVar37) * uVar37;
  *(uint *)(out[4] + 1) = (uint)(iVar31 < (int)uVar39) * iVar31 | (iVar31 >= (int)uVar39) * uVar39;
  *(uint *)((long)out[4] + 0xc) =
       (uint)(iVar31 < (int)uVar41) * iVar31 | (iVar31 >= (int)uVar41) * uVar41;
  uVar33 = (uint)(iVar21 < iVar2) * iVar2 | (uint)(iVar21 >= iVar2) * iVar21;
  uVar37 = (uint)(iVar23 < iVar2) * iVar2 | (uint)(iVar23 >= iVar2) * iVar23;
  uVar39 = (uint)(iVar24 < iVar2) * iVar2 | (uint)(iVar24 >= iVar2) * iVar24;
  uVar41 = (uint)(iVar25 < iVar2) * iVar2 | (uint)(iVar25 >= iVar2) * iVar25;
  *(uint *)out[5] = (uint)(iVar31 < (int)uVar33) * iVar31 | (iVar31 >= (int)uVar33) * uVar33;
  *(uint *)((long)out[5] + 4) =
       (uint)(iVar31 < (int)uVar37) * iVar31 | (iVar31 >= (int)uVar37) * uVar37;
  *(uint *)(out[5] + 1) = (uint)(iVar31 < (int)uVar39) * iVar31 | (iVar31 >= (int)uVar39) * uVar39;
  *(uint *)((long)out[5] + 0xc) =
       (uint)(iVar31 < (int)uVar41) * iVar31 | (iVar31 >= (int)uVar41) * uVar41;
  iVar21 = iVar62 + iVar47 >> auVar6;
  iVar23 = iVar65 + iVar47 >> auVar6;
  iVar24 = iVar66 + iVar47 >> auVar6;
  iVar25 = iVar67 + iVar47 >> auVar6;
  uVar33 = (uint)(iVar21 < iVar2) * iVar2 | (uint)(iVar21 >= iVar2) * iVar21;
  uVar37 = (uint)(iVar23 < iVar2) * iVar2 | (uint)(iVar23 >= iVar2) * iVar23;
  uVar39 = (uint)(iVar24 < iVar2) * iVar2 | (uint)(iVar24 >= iVar2) * iVar24;
  uVar41 = (uint)(iVar25 < iVar2) * iVar2 | (uint)(iVar25 >= iVar2) * iVar25;
  *(uint *)out[6] = (uint)(iVar31 < (int)uVar33) * iVar31 | (iVar31 >= (int)uVar33) * uVar33;
  *(uint *)((long)out[6] + 4) =
       (uint)(iVar31 < (int)uVar37) * iVar31 | (iVar31 >= (int)uVar37) * uVar37;
  *(uint *)(out[6] + 1) = (uint)(iVar31 < (int)uVar39) * iVar31 | (iVar31 >= (int)uVar39) * uVar39;
  *(uint *)((long)out[6] + 0xc) =
       (uint)(iVar31 < (int)uVar41) * iVar31 | (iVar31 >= (int)uVar41) * uVar41;
  iVar16 = iVar47 - iVar16 >> auVar6;
  iVar18 = iVar47 - iVar18 >> auVar6;
  iVar19 = iVar47 - iVar19 >> auVar6;
  iVar20 = iVar47 - iVar20 >> auVar6;
  uVar33 = (uint)(iVar16 < iVar2) * iVar2 | (uint)(iVar16 >= iVar2) * iVar16;
  uVar37 = (uint)(iVar18 < iVar2) * iVar2 | (uint)(iVar18 >= iVar2) * iVar18;
  uVar39 = (uint)(iVar19 < iVar2) * iVar2 | (uint)(iVar19 >= iVar2) * iVar19;
  uVar41 = (uint)(iVar20 < iVar2) * iVar2 | (uint)(iVar20 >= iVar2) * iVar20;
  *(uint *)out[7] = (uint)(iVar31 < (int)uVar33) * iVar31 | (iVar31 >= (int)uVar33) * uVar33;
  *(uint *)((long)out[7] + 4) =
       (uint)(iVar31 < (int)uVar37) * iVar31 | (iVar31 >= (int)uVar37) * uVar37;
  *(uint *)(out[7] + 1) = (uint)(iVar31 < (int)uVar39) * iVar31 | (iVar31 >= (int)uVar39) * uVar39;
  *(uint *)((long)out[7] + 0xc) =
       (uint)(iVar31 < (int)uVar41) * iVar31 | (iVar31 >= (int)uVar41) * uVar41;
  iVar4 = iVar4 + iVar47 >> auVar6;
  iVar5 = iVar5 + iVar47 >> auVar6;
  iVar7 = iVar7 + iVar47 >> auVar6;
  iVar8 = iVar8 + iVar47 >> auVar6;
  uVar33 = (uint)(iVar4 < iVar2) * iVar2 | (uint)(iVar4 >= iVar2) * iVar4;
  uVar37 = (uint)(iVar5 < iVar2) * iVar2 | (uint)(iVar5 >= iVar2) * iVar5;
  uVar39 = (uint)(iVar7 < iVar2) * iVar2 | (uint)(iVar7 >= iVar2) * iVar7;
  uVar41 = (uint)(iVar8 < iVar2) * iVar2 | (uint)(iVar8 >= iVar2) * iVar8;
  *(uint *)out[8] = (uint)(iVar31 < (int)uVar33) * iVar31 | (iVar31 >= (int)uVar33) * uVar33;
  *(uint *)((long)out[8] + 4) =
       (uint)(iVar31 < (int)uVar37) * iVar31 | (iVar31 >= (int)uVar37) * uVar37;
  *(uint *)(out[8] + 1) = (uint)(iVar31 < (int)uVar39) * iVar31 | (iVar31 >= (int)uVar39) * uVar39;
  *(uint *)((long)out[8] + 0xc) =
       (uint)(iVar31 < (int)uVar41) * iVar31 | (iVar31 >= (int)uVar41) * uVar41;
  iVar4 = iVar47 - iVar42 >> auVar6;
  iVar5 = iVar47 - iVar43 >> auVar6;
  iVar7 = iVar47 - iVar44 >> auVar6;
  iVar8 = iVar47 - iVar45 >> auVar6;
  uVar33 = (uint)(iVar4 < iVar2) * iVar2 | (uint)(iVar4 >= iVar2) * iVar4;
  uVar37 = (uint)(iVar5 < iVar2) * iVar2 | (uint)(iVar5 >= iVar2) * iVar5;
  uVar39 = (uint)(iVar7 < iVar2) * iVar2 | (uint)(iVar7 >= iVar2) * iVar7;
  uVar41 = (uint)(iVar8 < iVar2) * iVar2 | (uint)(iVar8 >= iVar2) * iVar8;
  *(uint *)out[9] = (uint)(iVar31 < (int)uVar33) * iVar31 | (iVar31 >= (int)uVar33) * uVar33;
  *(uint *)((long)out[9] + 4) =
       (uint)(iVar31 < (int)uVar37) * iVar31 | (iVar31 >= (int)uVar37) * uVar37;
  *(uint *)(out[9] + 1) = (uint)(iVar31 < (int)uVar39) * iVar31 | (iVar31 >= (int)uVar39) * uVar39;
  *(uint *)((long)out[9] + 0xc) =
       (uint)(iVar31 < (int)uVar41) * iVar31 | (iVar31 >= (int)uVar41) * uVar41;
  iVar4 = iVar13 + iVar47 >> auVar6;
  iVar5 = iVar26 + iVar47 >> auVar6;
  iVar7 = iVar29 + iVar47 >> auVar6;
  iVar8 = iVar30 + iVar47 >> auVar6;
  uVar33 = (uint)(iVar4 < iVar2) * iVar2 | (uint)(iVar4 >= iVar2) * iVar4;
  uVar37 = (uint)(iVar5 < iVar2) * iVar2 | (uint)(iVar5 >= iVar2) * iVar5;
  uVar39 = (uint)(iVar7 < iVar2) * iVar2 | (uint)(iVar7 >= iVar2) * iVar7;
  uVar41 = (uint)(iVar8 < iVar2) * iVar2 | (uint)(iVar8 >= iVar2) * iVar8;
  *(uint *)out[10] = (uint)(iVar31 < (int)uVar33) * iVar31 | (iVar31 >= (int)uVar33) * uVar33;
  *(uint *)((long)out[10] + 4) =
       (uint)(iVar31 < (int)uVar37) * iVar31 | (iVar31 >= (int)uVar37) * uVar37;
  *(uint *)(out[10] + 1) = (uint)(iVar31 < (int)uVar39) * iVar31 | (iVar31 >= (int)uVar39) * uVar39;
  *(uint *)((long)out[10] + 0xc) =
       (uint)(iVar31 < (int)uVar41) * iVar31 | (iVar31 >= (int)uVar41) * uVar41;
  iVar4 = iVar47 - iVar9 >> auVar6;
  iVar5 = iVar47 - iVar10 >> auVar6;
  iVar7 = iVar47 - iVar11 >> auVar6;
  iVar8 = iVar47 - iVar12 >> auVar6;
  uVar33 = (uint)(iVar4 < iVar2) * iVar2 | (uint)(iVar4 >= iVar2) * iVar4;
  uVar37 = (uint)(iVar5 < iVar2) * iVar2 | (uint)(iVar5 >= iVar2) * iVar5;
  uVar39 = (uint)(iVar7 < iVar2) * iVar2 | (uint)(iVar7 >= iVar2) * iVar7;
  uVar41 = (uint)(iVar8 < iVar2) * iVar2 | (uint)(iVar8 >= iVar2) * iVar8;
  *(uint *)out[0xb] = (uint)(iVar31 < (int)uVar33) * iVar31 | (iVar31 >= (int)uVar33) * uVar33;
  *(uint *)((long)out[0xb] + 4) =
       (uint)(iVar31 < (int)uVar37) * iVar31 | (iVar31 >= (int)uVar37) * uVar37;
  *(uint *)(out[0xb] + 1) = (uint)(iVar31 < (int)uVar39) * iVar31 | (iVar31 >= (int)uVar39) * uVar39
  ;
  *(uint *)((long)out[0xb] + 0xc) =
       (uint)(iVar31 < (int)uVar41) * iVar31 | (iVar31 >= (int)uVar41) * uVar41;
  iVar9 = (int)alVar15[0] + iVar47 >> auVar6;
  iVar10 = alVar15[0]._4_4_ + iVar47 >> auVar6;
  iVar11 = (int)alVar15[1] + iVar47 >> auVar6;
  iVar12 = alVar15[1]._4_4_ + iVar47 >> auVar6;
  iVar4 = iVar47 - auVar46._0_4_ >> auVar6;
  iVar5 = iVar47 - auVar46._4_4_ >> auVar6;
  iVar7 = iVar47 - auVar46._8_4_ >> auVar6;
  iVar8 = iVar47 - auVar46._12_4_ >> auVar6;
  uVar33 = (uint)(iVar9 < iVar2) * iVar2 | (uint)(iVar9 >= iVar2) * iVar9;
  uVar37 = (uint)(iVar10 < iVar2) * iVar2 | (uint)(iVar10 >= iVar2) * iVar10;
  uVar39 = (uint)(iVar11 < iVar2) * iVar2 | (uint)(iVar11 >= iVar2) * iVar11;
  uVar41 = (uint)(iVar12 < iVar2) * iVar2 | (uint)(iVar12 >= iVar2) * iVar12;
  *(uint *)out[0xc] = (uint)(iVar31 < (int)uVar33) * iVar31 | (iVar31 >= (int)uVar33) * uVar33;
  *(uint *)((long)out[0xc] + 4) =
       (uint)(iVar31 < (int)uVar37) * iVar31 | (iVar31 >= (int)uVar37) * uVar37;
  *(uint *)(out[0xc] + 1) = (uint)(iVar31 < (int)uVar39) * iVar31 | (iVar31 >= (int)uVar39) * uVar39
  ;
  *(uint *)((long)out[0xc] + 0xc) =
       (uint)(iVar31 < (int)uVar41) * iVar31 | (iVar31 >= (int)uVar41) * uVar41;
  uVar33 = (uint)(iVar4 < iVar2) * iVar2 | (uint)(iVar4 >= iVar2) * iVar4;
  uVar37 = (uint)(iVar5 < iVar2) * iVar2 | (uint)(iVar5 >= iVar2) * iVar5;
  uVar39 = (uint)(iVar7 < iVar2) * iVar2 | (uint)(iVar7 >= iVar2) * iVar7;
  uVar41 = (uint)(iVar8 < iVar2) * iVar2 | (uint)(iVar8 >= iVar2) * iVar8;
  *(uint *)out[0xd] = (uint)(iVar31 < (int)uVar33) * iVar31 | (iVar31 >= (int)uVar33) * uVar33;
  *(uint *)((long)out[0xd] + 4) =
       (uint)(iVar31 < (int)uVar37) * iVar31 | (iVar31 >= (int)uVar37) * uVar37;
  *(uint *)(out[0xd] + 1) = (uint)(iVar31 < (int)uVar39) * iVar31 | (iVar31 >= (int)uVar39) * uVar39
  ;
  *(uint *)((long)out[0xd] + 0xc) =
       (uint)(iVar31 < (int)uVar41) * iVar31 | (iVar31 >= (int)uVar41) * uVar41;
  iVar4 = iVar61 + iVar47 >> auVar6;
  iVar5 = iVar64 + iVar47 >> auVar6;
  iVar7 = auVar63._8_4_ + iVar47 >> auVar6;
  iVar8 = auVar63._12_4_ + iVar47 >> auVar6;
  iVar9 = iVar47 - auVar22._0_4_ >> auVar6;
  iVar10 = iVar47 - auVar22._4_4_ >> auVar6;
  iVar11 = iVar47 - auVar22._8_4_ >> auVar6;
  iVar12 = iVar47 - auVar22._12_4_ >> auVar6;
  uVar33 = (uint)(iVar4 < iVar2) * iVar2 | (uint)(iVar4 >= iVar2) * iVar4;
  uVar37 = (uint)(iVar5 < iVar2) * iVar2 | (uint)(iVar5 >= iVar2) * iVar5;
  uVar39 = (uint)(iVar7 < iVar2) * iVar2 | (uint)(iVar7 >= iVar2) * iVar7;
  uVar41 = (uint)(iVar8 < iVar2) * iVar2 | (uint)(iVar8 >= iVar2) * iVar8;
  uVar48 = (uint)(iVar9 < iVar2) * iVar2 | (uint)(iVar9 >= iVar2) * iVar9;
  uVar50 = (uint)(iVar10 < iVar2) * iVar2 | (uint)(iVar10 >= iVar2) * iVar10;
  uVar51 = (uint)(iVar11 < iVar2) * iVar2 | (uint)(iVar11 >= iVar2) * iVar11;
  uVar52 = (uint)(iVar12 < iVar2) * iVar2 | (uint)(iVar12 >= iVar2) * iVar12;
  *(uint *)out[0xe] = (uint)(iVar31 < (int)uVar33) * iVar31 | (iVar31 >= (int)uVar33) * uVar33;
  *(uint *)((long)out[0xe] + 4) =
       (uint)(iVar31 < (int)uVar37) * iVar31 | (iVar31 >= (int)uVar37) * uVar37;
  *(uint *)(out[0xe] + 1) = (uint)(iVar31 < (int)uVar39) * iVar31 | (iVar31 >= (int)uVar39) * uVar39
  ;
  *(uint *)((long)out[0xe] + 0xc) =
       (uint)(iVar31 < (int)uVar41) * iVar31 | (iVar31 >= (int)uVar41) * uVar41;
  *(uint *)out[0xf] = (uint)(iVar31 < (int)uVar48) * iVar31 | (iVar31 >= (int)uVar48) * uVar48;
  *(uint *)((long)out[0xf] + 4) =
       (uint)(iVar31 < (int)uVar50) * iVar31 | (iVar31 >= (int)uVar50) * uVar50;
  *(uint *)(out[0xf] + 1) = (uint)(iVar31 < (int)uVar51) * iVar31 | (iVar31 >= (int)uVar51) * uVar51
  ;
  *(uint *)((long)out[0xf] + 0xc) =
       (uint)(iVar31 < (int)uVar52) * iVar31 | (iVar31 >= (int)uVar52) * uVar52;
  return;
}

Assistant:

static void iadst16x16_low1_sse4_1(__m128i *in, __m128i *out, int bit,
                                   int do_cols, int bd, int out_shift) {
  const int32_t *cospi = cospi_arr(bit);
  const __m128i cospi2 = _mm_set1_epi32(cospi[2]);
  const __m128i cospi62 = _mm_set1_epi32(cospi[62]);
  const __m128i cospi8 = _mm_set1_epi32(cospi[8]);
  const __m128i cospi56 = _mm_set1_epi32(cospi[56]);
  const __m128i cospi48 = _mm_set1_epi32(cospi[48]);
  const __m128i cospi16 = _mm_set1_epi32(cospi[16]);
  const __m128i cospi32 = _mm_set1_epi32(cospi[32]);
  const __m128i rnding = _mm_set1_epi32(1 << (bit - 1));
  const __m128i zero = _mm_setzero_si128();
  __m128i v[16], x, y, temp1, temp2;
  // stage 0
  // stage 1
  // stage 2
  x = _mm_mullo_epi32(in[0], cospi62);
  v[0] = _mm_add_epi32(x, rnding);
  v[0] = _mm_srai_epi32(v[0], bit);

  x = _mm_mullo_epi32(in[0], cospi2);
  v[1] = _mm_sub_epi32(zero, x);
  v[1] = _mm_add_epi32(v[1], rnding);
  v[1] = _mm_srai_epi32(v[1], bit);

  // stage 3
  v[8] = v[0];
  v[9] = v[1];

  // stage 4
  temp1 = _mm_mullo_epi32(v[8], cospi8);
  x = _mm_mullo_epi32(v[9], cospi56);
  temp1 = _mm_add_epi32(temp1, x);
  temp1 = _mm_add_epi32(temp1, rnding);
  temp1 = _mm_srai_epi32(temp1, bit);

  temp2 = _mm_mullo_epi32(v[8], cospi56);
  x = _mm_mullo_epi32(v[9], cospi8);
  temp2 = _mm_sub_epi32(temp2, x);
  temp2 = _mm_add_epi32(temp2, rnding);
  temp2 = _mm_srai_epi32(temp2, bit);
  v[8] = temp1;
  v[9] = temp2;

  // stage 5
  v[4] = v[0];
  v[5] = v[1];
  v[12] = v[8];
  v[13] = v[9];

  // stage 6
  temp1 = _mm_mullo_epi32(v[4], cospi16);
  x = _mm_mullo_epi32(v[5], cospi48);
  temp1 = _mm_add_epi32(temp1, x);
  temp1 = _mm_add_epi32(temp1, rnding);
  temp1 = _mm_srai_epi32(temp1, bit);

  temp2 = _mm_mullo_epi32(v[4], cospi48);
  x = _mm_mullo_epi32(v[5], cospi16);
  temp2 = _mm_sub_epi32(temp2, x);
  temp2 = _mm_add_epi32(temp2, rnding);
  temp2 = _mm_srai_epi32(temp2, bit);
  v[4] = temp1;
  v[5] = temp2;

  temp1 = _mm_mullo_epi32(v[12], cospi16);
  x = _mm_mullo_epi32(v[13], cospi48);
  temp1 = _mm_add_epi32(temp1, x);
  temp1 = _mm_add_epi32(temp1, rnding);
  temp1 = _mm_srai_epi32(temp1, bit);

  temp2 = _mm_mullo_epi32(v[12], cospi48);
  x = _mm_mullo_epi32(v[13], cospi16);
  temp2 = _mm_sub_epi32(temp2, x);
  temp2 = _mm_add_epi32(temp2, rnding);
  temp2 = _mm_srai_epi32(temp2, bit);
  v[12] = temp1;
  v[13] = temp2;

  // stage 7
  v[2] = v[0];
  v[3] = v[1];
  v[6] = v[4];
  v[7] = v[5];
  v[10] = v[8];
  v[11] = v[9];
  v[14] = v[12];
  v[15] = v[13];

  // stage 8
  y = _mm_mullo_epi32(v[2], cospi32);
  x = _mm_mullo_epi32(v[3], cospi32);
  v[2] = _mm_add_epi32(y, x);
  v[2] = _mm_add_epi32(v[2], rnding);
  v[2] = _mm_srai_epi32(v[2], bit);

  v[3] = _mm_sub_epi32(y, x);
  v[3] = _mm_add_epi32(v[3], rnding);
  v[3] = _mm_srai_epi32(v[3], bit);

  y = _mm_mullo_epi32(v[6], cospi32);
  x = _mm_mullo_epi32(v[7], cospi32);
  v[6] = _mm_add_epi32(y, x);
  v[6] = _mm_add_epi32(v[6], rnding);
  v[6] = _mm_srai_epi32(v[6], bit);

  v[7] = _mm_sub_epi32(y, x);
  v[7] = _mm_add_epi32(v[7], rnding);
  v[7] = _mm_srai_epi32(v[7], bit);

  y = _mm_mullo_epi32(v[10], cospi32);
  x = _mm_mullo_epi32(v[11], cospi32);
  v[10] = _mm_add_epi32(y, x);
  v[10] = _mm_add_epi32(v[10], rnding);
  v[10] = _mm_srai_epi32(v[10], bit);

  v[11] = _mm_sub_epi32(y, x);
  v[11] = _mm_add_epi32(v[11], rnding);
  v[11] = _mm_srai_epi32(v[11], bit);

  y = _mm_mullo_epi32(v[14], cospi32);
  x = _mm_mullo_epi32(v[15], cospi32);
  v[14] = _mm_add_epi32(y, x);
  v[14] = _mm_add_epi32(v[14], rnding);
  v[14] = _mm_srai_epi32(v[14], bit);

  v[15] = _mm_sub_epi32(y, x);
  v[15] = _mm_add_epi32(v[15], rnding);
  v[15] = _mm_srai_epi32(v[15], bit);

  // stage 9
  if (do_cols) {
    out[0] = v[0];
    out[1] = _mm_sub_epi32(zero, v[8]);
    out[2] = v[12];
    out[3] = _mm_sub_epi32(zero, v[4]);
    out[4] = v[6];
    out[5] = _mm_sub_epi32(zero, v[14]);
    out[6] = v[10];
    out[7] = _mm_sub_epi32(zero, v[2]);
    out[8] = v[3];
    out[9] = _mm_sub_epi32(zero, v[11]);
    out[10] = v[15];
    out[11] = _mm_sub_epi32(zero, v[7]);
    out[12] = v[5];
    out[13] = _mm_sub_epi32(zero, v[13]);
    out[14] = v[9];
    out[15] = _mm_sub_epi32(zero, v[1]);
  } else {
    const int log_range_out = AOMMAX(16, bd + 6);
    const __m128i clamp_lo_out = _mm_set1_epi32(-(1 << (log_range_out - 1)));
    const __m128i clamp_hi_out = _mm_set1_epi32((1 << (log_range_out - 1)) - 1);

    neg_shift_sse4_1(v[0], v[8], out + 0, out + 1, &clamp_lo_out, &clamp_hi_out,
                     out_shift);
    neg_shift_sse4_1(v[12], v[4], out + 2, out + 3, &clamp_lo_out,
                     &clamp_hi_out, out_shift);
    neg_shift_sse4_1(v[6], v[14], out + 4, out + 5, &clamp_lo_out,
                     &clamp_hi_out, out_shift);
    neg_shift_sse4_1(v[10], v[2], out + 6, out + 7, &clamp_lo_out,
                     &clamp_hi_out, out_shift);
    neg_shift_sse4_1(v[3], v[11], out + 8, out + 9, &clamp_lo_out,
                     &clamp_hi_out, out_shift);
    neg_shift_sse4_1(v[15], v[7], out + 10, out + 11, &clamp_lo_out,
                     &clamp_hi_out, out_shift);
    neg_shift_sse4_1(v[5], v[13], out + 12, out + 13, &clamp_lo_out,
                     &clamp_hi_out, out_shift);
    neg_shift_sse4_1(v[9], v[1], out + 14, out + 15, &clamp_lo_out,
                     &clamp_hi_out, out_shift);
  }
}